

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferTests.cpp
# Opt level: O3

SparseAllocationBuilder * __thiscall
vkt::sparse::anon_unknown_0::SparseAllocationBuilder::addMemoryBind
          (SparseAllocationBuilder *this,deUint32 numChunks)

{
  pointer puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  value_type local_18;
  
  local_18.allocationNdx = this->m_allocationNdx;
  local_18.resourceChunkNdx = this->m_resourceChunkNdx;
  local_18.memoryChunkNdx = this->m_memoryChunkNdx;
  local_18.numChunks = 1;
  std::
  vector<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
  ::push_back(&this->m_memoryBinds,&local_18);
  uVar2 = this->m_resourceChunkNdx;
  uVar3 = this->m_memoryChunkNdx;
  this->m_resourceChunkNdx = uVar2 + 1;
  this->m_memoryChunkNdx = uVar3 + 1;
  puVar1 = (this->m_chunksPerAllocation).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start + this->m_allocationNdx;
  *puVar1 = *puVar1 + 1;
  return this;
}

Assistant:

SparseAllocationBuilder& SparseAllocationBuilder::addMemoryBind (const deUint32 numChunks)
{
	const MemoryBind memoryBind =
	{
		m_allocationNdx,
		m_resourceChunkNdx,
		m_memoryChunkNdx,
		numChunks
	};
	m_memoryBinds.push_back(memoryBind);

	m_resourceChunkNdx						+= numChunks;
	m_memoryChunkNdx						+= numChunks;
	m_chunksPerAllocation[m_allocationNdx]	+= numChunks;

	return *this;
}